

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(Curl_easy *data,connectdata *conn,int sockindex,_Bool nonblocking,
                            _Bool *done)

{
  curl_socket_t cVar1;
  ssl_connect_state sVar2;
  ssl_backend_data *psVar3;
  ssl_backend_data *psVar4;
  ulong uVar5;
  hostname *phVar6;
  ssl_config_data *psVar7;
  ssl_config_data *psVar8;
  ssl_config_data *psVar9;
  byte bVar10;
  byte bVar11;
  uchar uVar12;
  _Bool _Var13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  CURLcode CVar17;
  CURLcode CVar18;
  int iVar19;
  long lVar20;
  timediff_t tVar21;
  char *pcVar22;
  SSL_CIPHER *c;
  char *pcVar23;
  uint *puVar24;
  ulong uVar25;
  SSL_METHOD *meth;
  SSL_CTX *pSVar26;
  BIO_METHOD *pBVar27;
  BIO *pBVar28;
  X509 *pXVar29;
  X509_NAME *pXVar30;
  ASN1_TIME *pAVar31;
  int *piVar32;
  OCSP_RESPONSE *resp;
  X509_PUBKEY *pXVar33;
  uchar *pubkey;
  curl_blob *pcVar34;
  X509 *pXVar35;
  curl_blob **ppcVar36;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar37;
  X509 *issuer;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *ssl;
  EVP_MD *dgst;
  OCSP_CERTID *id;
  long lVar38;
  long lVar39;
  char **ppcVar40;
  curl_socket_t writefd;
  long lVar41;
  size_t size;
  size_t size_00;
  size_t size_01;
  size_t size_02;
  size_t size_03;
  size_t size_04;
  size_t size_05;
  size_t size_06;
  size_t size_07;
  size_t size_08;
  long lVar42;
  curl_socket_t readfd0;
  undefined8 in_R9;
  undefined7 uVar43;
  char **ppcVar44;
  bool bVar45;
  char *local_9f8;
  char local_9e8;
  char *local_9e0;
  int cert_status;
  char *local_9d0;
  char *local_9c8;
  X509 *local_9c0;
  curl_blob *local_9b8;
  int local_9b0;
  int crl_reason;
  char *local_9a8;
  curl_blob *local_9a0;
  char *local_998;
  undefined8 local_990;
  void *ssl_sessionid;
  curl_socket_t local_97c;
  _Bool *local_978;
  long local_970;
  in6_addr addr;
  char *local_958;
  ASN1_GENERALIZEDTIME *local_950;
  ASN1_GENERALIZEDTIME *thisupd;
  ASN1_GENERALIZEDTIME *rev;
  char extramsg [80];
  char error_buffer [256];
  
  lVar20 = (long)sockindex;
  if (conn->ssl[lVar20].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  cVar1 = conn->sock[lVar20];
  local_978 = done;
  local_970 = lVar20;
  if (conn->ssl[lVar20].connecting_state == ssl_connect_1) {
    tVar21 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar21 < 0) {
LAB_0055cc6e:
      Curl_failf(data,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    local_97c = conn->sock[local_970];
    ssl_sessionid = (void *)0x0;
    uVar43 = (undefined7)((ulong)in_R9 >> 8);
    if ((conn->http_proxy).proxytype == '\x02') {
      if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
        local_9a8 = (conn->host).name;
        local_9f8 = (char *)(conn->ssl_config).version;
        pcVar34 = (conn->ssl_config).ca_info_blob;
        local_9e0 = (data->set).ssl.primary.clientcert;
        local_9b8 = (data->set).ssl.primary.cert_blob;
        local_9c0 = (X509 *)(data->set).ssl.cert_type;
        lVar39 = 0x588;
        lVar38 = 0x2f1;
        lVar41 = 0x290;
        local_9a0 = (curl_blob *)0x0;
        if (pcVar34 == (curl_blob *)0x0) {
          local_990 = CONCAT71(uVar43,1);
          goto LAB_0055cc89;
        }
      }
      else {
        local_9a8 = (conn->http_proxy).host.name;
        local_9f8 = (char *)(conn->proxy_ssl_config).version;
        pcVar34 = (conn->proxy_ssl_config).ca_info_blob;
        local_9e0 = (data->set).proxy_ssl.primary.clientcert;
        local_9b8 = (data->set).proxy_ssl.primary.cert_blob;
        local_9c0 = (X509 *)(data->set).proxy_ssl.cert_type;
        lVar39 = 0x648;
        lVar38 = 0x369;
        lVar41 = 0x308;
        local_9a0 = (curl_blob *)0x0;
        if (pcVar34 == (curl_blob *)0x0) {
          local_990 = CONCAT71(uVar43,1);
          lVar42 = 0x310;
          goto LAB_0055ce57;
        }
      }
      local_990 = 0;
      local_9d0 = (char *)0x0;
      local_9a0 = pcVar34;
    }
    else {
      local_9a8 = (conn->host).name;
      local_9f8 = (char *)(conn->ssl_config).version;
      local_9a0 = (conn->ssl_config).ca_info_blob;
      local_9e0 = (data->set).ssl.primary.clientcert;
      local_9b8 = (data->set).ssl.primary.cert_blob;
      local_9c0 = (X509 *)(data->set).ssl.cert_type;
      lVar39 = 0x588;
      lVar38 = 0x2f1;
      lVar41 = 0x290;
      local_990 = CONCAT71(uVar43,local_9a0 == (curl_blob *)0x0);
      if (local_9a0 == (curl_blob *)0x0) {
LAB_0055cc89:
        lVar41 = 0x290;
        lVar38 = 0x2f1;
        lVar39 = 0x588;
        lVar42 = 0x298;
LAB_0055ce57:
        local_9d0 = *(char **)((conn->chunk).hexbuffer + lVar42 + -0x3d);
      }
      else {
        local_9d0 = (char *)0x0;
      }
    }
    pcVar22 = local_9f8;
    local_998 = *(char **)((conn->chunk).hexbuffer + lVar41 + -0x3d);
    bVar10 = (conn->chunk).hexbuffer[lVar38 + -0x3d];
    local_9c8 = *(char **)((long)&data->magic + lVar39);
    psVar3 = conn->ssl[lVar20].backend;
    local_9b0 = sockindex;
    CVar17 = ossl_seed(data);
    if (CVar17 != CURLE_OK) {
      return CVar17;
    }
    if (((conn->http_proxy).proxytype != '\x02') ||
       (lVar39 = 0x678, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar39 = 0x5b8;
    }
    *(undefined8 *)((long)&data->magic + lVar39) = 1;
    if (7 < local_9f8) {
      pcVar22 = "Unrecognized parameter passed via CURLOPT_SSLVERSION";
      goto LAB_0055d2ea;
    }
    if ((0xf3UL >> ((ulong)local_9f8 & 0x3f) & 1) == 0) {
      if (local_9f8 == (char *)0x2) {
        pcVar22 = "No SSLv2 support";
      }
      else {
        pcVar22 = "No SSLv3 support";
      }
      Curl_failf(data,pcVar22);
      return CURLE_NOT_BUILT_IN;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar26 = SSL_CTX_new(meth);
    psVar3->ctx = (SSL_CTX *)pSVar26;
    if (pSVar26 == (SSL_CTX *)0x0) {
      uVar25 = ERR_peek_error();
      pcVar22 = error_buffer;
      ossl_strerror(uVar25,pcVar22,size_00);
      pcVar23 = "SSL: couldn\'t create a context: %s";
      goto LAB_0055d14b;
    }
    SSL_CTX_ctrl(pSVar26,0x21,0x10,(void *)0x0);
    if (((data->set).fdebug != (curl_debug_callback)0x0) && (((data->set).field_0x8e5 & 8) != 0)) {
      SSL_CTX_set_msg_callback((SSL_CTX *)psVar3->ctx,ossl_trace);
      SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x10,0,conn);
      (conn->ssl[0].backend)->logger = data;
    }
    uVar12 = (conn->http_proxy).proxytype;
    if ((uVar12 == '\x02') &&
       (iVar14 = conn->sock[1], conn->proxy_ssl[iVar14 != -1].state != ssl_connection_complete)) {
      if (((data->set).proxy_ssl.field_0xb8 & 4) == 0) {
LAB_0055d306:
        local_9f8 = (char *)0x82024050;
        goto LAB_0055d312;
      }
      local_9f8 = (char *)0x82024850;
      if (((ulong)pcVar22 & 0xfffffffffffffffe) == 2) {
        return CURLE_NOT_BUILT_IN;
      }
      pSVar26 = (SSL_CTX *)psVar3->ctx;
LAB_0055d56b:
      lVar39 = 0x2f8;
      if (conn->proxy_ssl[iVar14 != -1].state == ssl_connection_complete) {
        lVar39 = 0x280;
      }
    }
    else {
      if (((data->set).ssl.field_0xb8 & 4) == 0) goto LAB_0055d306;
      local_9f8 = (char *)0x82024850;
LAB_0055d312:
      if (((ulong)pcVar22 & 0xfffffffffffffffe) == 2) {
        return CURLE_NOT_BUILT_IN;
      }
      pSVar26 = (SSL_CTX *)psVar3->ctx;
      lVar39 = 0x280;
      if (uVar12 == '\x02') {
        iVar14 = conn->sock[1];
        goto LAB_0055d56b;
      }
    }
    switch(*(undefined8 *)((conn->chunk).hexbuffer + lVar39 + -0x3d)) {
    case 0:
      goto switchD_0055d5aa_caseD_0;
    case 1:
    case 4:
      lVar39 = 0x301;
      break;
    default:
      lVar39 = 0;
      break;
    case 5:
      lVar39 = 0x302;
      break;
    case 6:
      lVar39 = 0x303;
      break;
    case 7:
      lVar39 = 0x304;
    }
    lVar39 = SSL_CTX_ctrl(pSVar26,0x7b,lVar39,(void *)0x0);
    if (lVar39 == 0) {
      return CURLE_SSL_CONNECT_ERROR;
    }
    uVar12 = (conn->http_proxy).proxytype;
switchD_0055d5aa_caseD_0:
    if ((uVar12 != '\x02') ||
       (lVar39 = 0x300, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar39 = 0x288;
    }
    uVar25 = *(ulong *)((conn->chunk).hexbuffer + lVar39 + -0x3d);
    uVar5 = uVar25 << 0x30;
    uVar25 = uVar25 >> 0x10;
    lVar39 = (uVar5 | uVar25) + 0x2fd;
    if ((uVar5 | uVar25 & 0xfffffffffffffffc) != 4) {
      lVar39 = 0;
    }
    lVar39 = SSL_CTX_ctrl(pSVar26,0x7c,lVar39,(void *)0x0);
    if (lVar39 == 0) {
      return CURLE_SSL_CONNECT_ERROR;
    }
    SSL_CTX_set_options(psVar3->ctx,local_9f8);
    uVar15 = *(uint *)&(conn->bits).field_0x4;
    if ((uVar15 >> 0x1a & 1) != 0) {
      lVar39 = 0;
      if ((2 < (data->state).httpwant) &&
         ((((conn->http_proxy).proxytype != '\x02' || ((uVar15 & 8) == 0)) ||
          (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)))) {
        extramsg[0] = '\x02';
        extramsg[1] = 'h';
        extramsg[2] = '2';
        Curl_infof(data,"ALPN: offers %s","h2");
        lVar39 = 3;
      }
      builtin_strncpy(extramsg + lVar39,"\bhttp/1.1",9);
      Curl_infof(data,"ALPN: offers %s","http/1.1");
      iVar14 = SSL_CTX_set_alpn_protos(psVar3->ctx,extramsg,(int)lVar39 + 9);
      if (iVar14 != 0) {
        pcVar22 = "Error setting ALPN";
        goto LAB_0055d2ea;
      }
    }
    if ((local_9e0 != (char *)0x0 || local_9b8 != (curl_blob *)0x0) || local_9c0 != (X509 *)0x0) {
      if ((conn->http_proxy).proxytype == '\x02') {
        psVar7 = &(data->set).ssl;
        psVar8 = &(data->set).ssl;
        psVar9 = &(data->set).ssl;
        bVar45 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        if (!bVar45) {
          psVar9 = &(data->set).proxy_ssl;
          psVar7 = &(data->set).proxy_ssl;
          psVar8 = &(data->set).proxy_ssl;
        }
        ppcVar36 = &psVar8->key_blob;
        ppcVar40 = &psVar7->key;
        ppcVar44 = &psVar9->key_type;
        lVar39 = 0x6b0;
        if (bVar45) {
          lVar39 = 0x5f0;
        }
      }
      else {
        ppcVar40 = &(data->set).ssl.key;
        ppcVar36 = &(data->set).ssl.key_blob;
        ppcVar44 = &(data->set).ssl.key_type;
        lVar39 = 0x5f0;
      }
      iVar14 = cert_stuff(data,psVar3->ctx,local_9e0,local_9b8,(char *)local_9c0,*ppcVar40,*ppcVar36
                          ,*ppcVar44,*(char **)((long)&data->magic + lVar39));
      if (iVar14 == 0) {
        return CURLE_SSL_CERTPROBLEM;
      }
    }
    uVar12 = (conn->http_proxy).proxytype;
    if ((uVar12 != '\x02') ||
       (lVar39 = 0x328, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar39 = 0x2b0;
    }
    pcVar22 = *(char **)((conn->chunk).hexbuffer + lVar39 + -0x3d);
    if (pcVar22 != (char *)0x0) {
      iVar14 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar3->ctx,pcVar22);
      if (iVar14 == 0) {
        pcVar23 = "failed setting cipher list: %s";
        goto LAB_0055e0fe;
      }
      Curl_infof(data,"Cipher selection: %s",pcVar22);
      uVar12 = (conn->http_proxy).proxytype;
    }
    if ((uVar12 != '\x02') ||
       (lVar39 = 0x330, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar39 = 0x2b8;
    }
    pcVar22 = *(char **)((conn->chunk).hexbuffer + lVar39 + -0x3d);
    if (pcVar22 != (char *)0x0) {
      iVar14 = SSL_CTX_set_ciphersuites(psVar3->ctx,pcVar22);
      if (iVar14 == 0) {
        pcVar23 = "failed setting TLS 1.3 cipher suite: %s";
        goto LAB_0055e0fe;
      }
      Curl_infof(data,"TLS 1.3 cipher selection: %s",pcVar22);
    }
    SSL_CTX_set_post_handshake_auth(psVar3->ctx,1);
    if (((conn->http_proxy).proxytype != '\x02') ||
       (lVar39 = 0x360, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar39 = 0x2e8;
    }
    pcVar22 = *(char **)((conn->chunk).hexbuffer + lVar39 + -0x3d);
    if ((pcVar22 != (char *)0x0) &&
       (lVar39 = SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x5c,0,pcVar22), lVar39 == 0)) {
      pcVar23 = "failed setting curves list: \'%s\'";
LAB_0055e0fe:
      Curl_failf(data,pcVar23,pcVar22);
      return CURLE_SSL_CIPHER;
    }
    uVar15 = bVar10 & 1;
    local_9e8 = (char)uVar15;
    if (((char)local_990 == '\0') &&
       (CVar17 = load_cacert_from_memory(psVar3->ctx,local_9a0), CVar17 != CURLE_OK)) {
      if (CVar17 == CURLE_OUT_OF_MEMORY) {
        pcVar22 = "error importing CA certificate blob";
        goto LAB_0055e595;
      }
      if (local_9e8 != '\0') {
        Curl_failf(data,"error importing CA certificate blob");
        if (CVar17 != CURLE_OK) {
          return CVar17;
        }
        goto LAB_0055c87d;
      }
      Curl_infof(data,"error importing CA certificate blob, continuing anyway");
    }
    else if ((local_9e8 != '\0') && (local_9d0 != (char *)0x0 || local_998 != (char *)0x0)) {
      if ((local_9d0 != (char *)0x0) &&
         (iVar14 = SSL_CTX_load_verify_file(psVar3->ctx,local_9d0), iVar14 == 0)) {
        pcVar23 = "error setting certificate file: %s";
        pcVar22 = local_9d0;
LAB_0055e64e:
        Curl_failf(data,pcVar23,pcVar22);
        return CURLE_SSL_CACERT_BADFILE;
      }
      local_9f8 = "none";
      if (local_998 != (char *)0x0) {
        iVar14 = SSL_CTX_load_verify_dir(psVar3->ctx);
        if (iVar14 == 0) {
          pcVar23 = "error setting certificate path: %s";
          pcVar22 = local_998;
          goto LAB_0055e64e;
        }
        local_9f8 = local_998;
      }
      pcVar22 = "none";
      if (local_9d0 != (char *)0x0) {
        pcVar22 = local_9d0;
      }
      Curl_infof(data," CAfile: %s",pcVar22);
      Curl_infof(data," CApath: %s",local_9f8);
    }
    if (local_9c8 != (char *)0x0) {
      pXVar37 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      m = X509_LOOKUP_file();
      ctx = X509_STORE_add_lookup(pXVar37,m);
      if ((ctx == (X509_LOOKUP *)0x0) || (iVar14 = X509_load_crl_file(ctx,local_9c8,1), iVar14 == 0)
         ) {
        Curl_failf(data,"error loading CRL file: %s",local_9c8);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(data,"successfully loaded CRL file:");
      pXVar37 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      X509_STORE_set_flags(pXVar37,0xc);
      Curl_infof(data,"  CRLfile: %s",local_9c8);
    }
    if (local_9e8 != '\0') {
      pXVar37 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      X509_STORE_set_flags(pXVar37,0x8000);
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if (local_9c8 == (char *)0x0) {
          bVar10 = (data->set).proxy_ssl.field_0xb8;
LAB_0055e39d:
          if ((bVar10 & 0x10) == 0) {
            pXVar37 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
            X509_STORE_set_flags(pXVar37,0x80000);
          }
        }
      }
      else if (local_9c8 == (char *)0x0) {
        bVar10 = (data->set).ssl.field_0xb8;
        goto LAB_0055e39d;
      }
    }
    SSL_CTX_set_verify((SSL_CTX *)psVar3->ctx,uVar15,(callback *)0x0);
    _Var13 = Curl_tls_keylog_enabled();
    if (_Var13) {
      SSL_CTX_set_keylog_callback(psVar3->ctx,ossl_keylog_callback);
    }
    SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x2c,0x301,(void *)0x0);
    SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar3->ctx,ossl_new_session_cb);
    if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
      Curl_set_in_callback(data,true);
      CVar17 = (*(data->set).ssl.fsslctx)(data,psVar3->ctx,(data->set).ssl.fsslctxp);
      Curl_set_in_callback(data,false);
      if (CVar17 != CURLE_OK) {
        Curl_failf(data,"error signaled by ssl ctx callback");
        return CVar17;
      }
    }
    if ((SSL *)psVar3->handle != (SSL *)0x0) {
      SSL_free((SSL *)psVar3->handle);
    }
    ssl = SSL_new((SSL_CTX *)psVar3->ctx);
    psVar3->handle = (SSL *)ssl;
    if (ssl == (SSL *)0x0) {
      pcVar22 = "SSL: couldn\'t create a context (handle)";
LAB_0055e595:
      Curl_failf(data,pcVar22);
      return CURLE_OUT_OF_MEMORY;
    }
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar10 = (conn->proxy_ssl_config).field_0x71;
    }
    else {
      bVar10 = (conn->ssl_config).field_0x71;
    }
    if ((bVar10 & 4) != 0) {
      SSL_ctrl(ssl,0x41,1,(void *)0x0);
      ssl = (SSL *)psVar3->handle;
    }
    SSL_set_connect_state(ssl);
    pcVar22 = local_9a8;
    psVar3->server_cert = (X509 *)0x0;
    iVar14 = inet_pton(2,local_9a8,&addr);
    if (((iVar14 == 0) && (iVar14 = inet_pton(10,pcVar22,&addr), iVar14 == 0)) &&
       ((pcVar22 = Curl_ssl_snihost(data,pcVar22,(size_t *)0x0), pcVar22 == (char *)0x0 ||
        (lVar39 = SSL_ctrl((SSL *)psVar3->handle,0x37,0,pcVar22), lVar39 == 0)))) {
      pcVar22 = "Failed set SNI";
LAB_0055d2ea:
      Curl_failf(data,pcVar22);
      return CURLE_SSL_CONNECT_ERROR;
    }
    _Var13 = ossl_associate_connection(data,conn,local_9b0);
    if (!_Var13) {
      uVar25 = ERR_get_error();
      ossl_strerror(uVar25,error_buffer,size_06);
      pcVar22 = "SSL: ossl_associate_connection failed: %s";
LAB_0055e5c6:
      Curl_failf(data,pcVar22,error_buffer);
      return CURLE_SSL_CONNECT_ERROR;
    }
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar10 = (data->set).proxy_ssl.primary.field_0x71;
    }
    else {
      bVar10 = (data->set).ssl.primary.field_0x71;
    }
    if ((bVar10 & 8) != 0) {
      Curl_ssl_sessionid_lock(data);
      if ((conn->http_proxy).proxytype == '\x02') {
        _Var13 = conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete;
      }
      else {
        _Var13 = false;
      }
      _Var13 = Curl_ssl_getsessionid(data,conn,_Var13,&ssl_sessionid,(size_t *)0x0,local_9b0);
      if (!_Var13) {
        iVar14 = SSL_set_session((SSL *)psVar3->handle,(SSL_SESSION *)ssl_sessionid);
        if (iVar14 == 0) {
          Curl_ssl_sessionid_unlock(data);
          uVar25 = ERR_get_error();
          ossl_strerror(uVar25,error_buffer,size_08);
          pcVar22 = "SSL: SSL_set_session failed: %s";
          goto LAB_0055e5c6;
        }
        Curl_infof(data,"SSL re-using session ID");
      }
      Curl_ssl_sessionid_unlock(data);
    }
    if ((conn->proxy_ssl[lVar20].field_0x10 & 1) == 0) {
      iVar14 = SSL_set_fd((SSL *)psVar3->handle,local_97c);
      if (iVar14 == 0) {
        uVar25 = ERR_get_error();
        ossl_strerror(uVar25,error_buffer,size_07);
        pcVar22 = "SSL: SSL_set_fd failed: %s";
        goto LAB_0055e5c6;
      }
    }
    else {
      pBVar27 = BIO_f_ssl();
      pBVar28 = BIO_new(pBVar27);
      BIO_ctrl(pBVar28,0x6d,0,(conn->proxy_ssl[lVar20].backend)->handle);
      SSL_set_bio((SSL *)psVar3->handle,pBVar28,pBVar28);
    }
    conn->ssl[lVar20].connecting_state = ssl_connect_2;
  }
LAB_0055c87d:
  while (sVar2 = conn->ssl[lVar20].connecting_state, sVar2 - ssl_connect_2 < 3) {
    tVar21 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar21 < 0) goto LAB_0055cc6e;
    sVar2 = conn->ssl[lVar20].connecting_state;
    if ((sVar2 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar2 == ssl_connect_2_writing) {
        writefd = cVar1;
      }
      readfd0 = -1;
      if (sVar2 == ssl_connect_2_reading) {
        readfd0 = cVar1;
      }
      if (nonblocking) {
        tVar21 = 0;
      }
      iVar14 = Curl_socket_check(readfd0,-1,writefd,tVar21);
      if (iVar14 < 0) {
        puVar24 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar24);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar14 == 0) {
        if (nonblocking) {
          *local_978 = false;
          return CURLE_OK;
        }
        goto LAB_0055cc6e;
      }
    }
    psVar3 = conn->ssl[lVar20].backend;
    ERR_clear_error();
    iVar14 = SSL_connect((SSL *)psVar3->handle);
    if (iVar14 == 1) {
      conn->ssl[lVar20].connecting_state = ssl_connect_3;
      pcVar22 = SSL_get_version((SSL *)psVar3->handle);
      c = SSL_get_current_cipher((SSL *)psVar3->handle);
      pcVar23 = SSL_CIPHER_get_name(c);
      Curl_infof(data,"SSL connection using %s / %s",pcVar22,pcVar23);
      if (((conn->bits).field_0x7 & 4) != 0) {
        SSL_get0_alpn_selected(psVar3->handle,error_buffer,extramsg);
        if (extramsg._0_4_ == 0) {
          Curl_infof(data,"ALPN: server did not agree on a protocol. Uses default.");
        }
        else {
          Curl_infof(data,"ALPN: server accepted %.*s",extramsg._0_8_ & 0xffffffff,
                     error_buffer._0_8_);
          if (extramsg._0_4_ == 8) {
            if (*(long *)error_buffer._0_8_ == 0x312e312f70747468) {
              conn->alpn = '\x02';
            }
          }
          else if ((extramsg._0_4_ == 2) && (*(short *)error_buffer._0_8_ == 0x3268)) {
            conn->alpn = '\x03';
          }
        }
        Curl_multiuse_state(data,(uint)(conn->alpn == '\x03') * 3 + -1);
      }
    }
    else {
      uVar15 = SSL_get_error((SSL *)psVar3->handle,iVar14);
      if (uVar15 == 9) {
        conn->ssl[lVar20].connecting_state = ssl_connect_2;
      }
      else if (uVar15 == 3) {
        conn->ssl[lVar20].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar15 != 2) {
          memset(error_buffer,0,0x100);
          conn->ssl[lVar20].connecting_state = ssl_connect_2;
          uVar25 = ERR_get_error();
          uVar16 = (uint)uVar25;
          if ((uVar16 & 0xff800000) == 0xa000000 && -1 < (int)uVar16) {
            uVar16 = uVar16 & 0x7fffff;
            if (uVar16 != 0x86) {
              if (uVar16 == 0x45c) {
                ossl_strerror(uVar25,error_buffer,size);
                CVar17 = CURLE_SSL_CLIENTCERT;
                goto LAB_0055d98b;
              }
              if (uVar16 != 0x415) goto LAB_0055d00c;
            }
            lVar20 = SSL_get_verify_result((SSL *)psVar3->handle);
            if (lVar20 == 0) {
              builtin_strncpy(error_buffer,"SSL certificate verification failed",0x24);
              CVar17 = CURLE_PEER_FAILED_VERIFICATION;
            }
            else {
              if (((conn->http_proxy).proxytype != '\x02') ||
                 (lVar39 = 0x678,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar39 = 0x5b8;
              }
              *(long *)((long)&data->magic + lVar39) = lVar20;
              pcVar22 = X509_verify_cert_error_string(lVar20);
              curl_msnprintf(error_buffer,0x100,"SSL certificate problem: %s",pcVar22);
              CVar17 = CURLE_PEER_FAILED_VERIFICATION;
            }
          }
          else {
LAB_0055d00c:
            ossl_strerror(uVar25,error_buffer,size);
            CVar17 = CURLE_SSL_CONNECT_ERROR;
            if (uVar25 == 0) {
              if ((conn->http_proxy).proxytype == '\x02') {
                bVar45 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
                phVar6 = &(conn->http_proxy).host;
                if (bVar45) {
                  phVar6 = &conn->host;
                }
                lVar20 = (ulong)bVar45 * 4 + 0x568;
              }
              else {
                phVar6 = &conn->host;
                lVar20 = 0x56c;
              }
              pcVar22 = phVar6->name;
              iVar14 = *(int *)((conn->chunk).hexbuffer + lVar20 + -0x3d);
              extramsg[0x40] = '\0';
              extramsg[0x41] = '\0';
              extramsg[0x42] = '\0';
              extramsg[0x43] = '\0';
              extramsg[0x44] = '\0';
              extramsg[0x45] = '\0';
              extramsg[0x46] = '\0';
              extramsg[0x47] = '\0';
              extramsg[0x48] = '\0';
              extramsg[0x49] = '\0';
              extramsg[0x4a] = '\0';
              extramsg[0x4b] = '\0';
              extramsg[0x4c] = '\0';
              extramsg[0x4d] = '\0';
              extramsg[0x4e] = '\0';
              extramsg[0x4f] = '\0';
              extramsg[0x30] = '\0';
              extramsg[0x31] = '\0';
              extramsg[0x32] = '\0';
              extramsg[0x33] = '\0';
              extramsg[0x34] = '\0';
              extramsg[0x35] = '\0';
              extramsg[0x36] = '\0';
              extramsg[0x37] = '\0';
              extramsg[0x38] = '\0';
              extramsg[0x39] = '\0';
              extramsg[0x3a] = '\0';
              extramsg[0x3b] = '\0';
              extramsg[0x3c] = '\0';
              extramsg[0x3d] = '\0';
              extramsg[0x3e] = '\0';
              extramsg[0x3f] = '\0';
              extramsg[0x20] = '\0';
              extramsg[0x21] = '\0';
              extramsg[0x22] = '\0';
              extramsg[0x23] = '\0';
              extramsg[0x24] = '\0';
              extramsg[0x25] = '\0';
              extramsg[0x26] = '\0';
              extramsg[0x27] = '\0';
              extramsg[0x28] = '\0';
              extramsg[0x29] = '\0';
              extramsg[0x2a] = '\0';
              extramsg[0x2b] = '\0';
              extramsg[0x2c] = '\0';
              extramsg[0x2d] = '\0';
              extramsg[0x2e] = '\0';
              extramsg[0x2f] = '\0';
              extramsg[0x10] = '\0';
              extramsg[0x11] = '\0';
              extramsg[0x12] = '\0';
              extramsg[0x13] = '\0';
              extramsg[0x14] = '\0';
              extramsg[0x15] = '\0';
              extramsg[0x16] = '\0';
              extramsg[0x17] = '\0';
              extramsg[0x18] = '\0';
              extramsg[0x19] = '\0';
              extramsg[0x1a] = '\0';
              extramsg[0x1b] = '\0';
              extramsg[0x1c] = '\0';
              extramsg[0x1d] = '\0';
              extramsg[0x1e] = '\0';
              extramsg[0x1f] = '\0';
              extramsg[0] = '\0';
              extramsg[1] = '\0';
              extramsg[2] = '\0';
              extramsg[3] = '\0';
              extramsg[4] = '\0';
              extramsg[5] = '\0';
              extramsg[6] = '\0';
              extramsg[7] = '\0';
              extramsg[8] = '\0';
              extramsg[9] = '\0';
              extramsg[10] = '\0';
              extramsg[0xb] = '\0';
              extramsg[0xc] = '\0';
              extramsg[0xd] = '\0';
              extramsg[0xe] = '\0';
              extramsg[0xf] = '\0';
              piVar32 = __errno_location();
              if (uVar15 == 5 && *piVar32 != 0) {
                Curl_strerror(*piVar32,extramsg,0x50);
                pcVar23 = "SSL_ERROR_SYSCALL";
                if (extramsg[0] != '\0') {
                  pcVar23 = extramsg;
                }
              }
              else if (uVar15 < 0xb) {
                pcVar23 = (&PTR_anon_var_dwarf_23301ad_008c0458)[uVar15];
              }
              else {
                pcVar23 = "SSL_ERROR unknown";
              }
              Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar23,pcVar22,
                         (long)iVar14);
              return CURLE_SSL_CONNECT_ERROR;
            }
          }
LAB_0055d98b:
          Curl_failf(data,"%s",error_buffer);
          return CVar17;
        }
        conn->ssl[lVar20].connecting_state = ssl_connect_2_reading;
      }
    }
    if ((nonblocking) && (conn->ssl[lVar20].connecting_state - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar2 == ssl_connect_3) {
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar10 = (conn->proxy_ssl_config).field_0x71;
    }
    else {
      bVar10 = (conn->ssl_config).field_0x71;
    }
    bVar11 = 1;
    if ((bVar10 & 1) == 0) {
      bVar11 = (bVar10 & 2) >> 1;
    }
    memset(extramsg,0,0x100);
    pBVar27 = BIO_s_mem();
    pBVar28 = BIO_new(pBVar27);
    if (pBVar28 == (BIO *)0x0) {
      uVar25 = ERR_get_error();
      pcVar22 = extramsg;
      ossl_strerror(uVar25,pcVar22,size_01);
      pcVar23 = "BIO_new return NULL, OpenSSL error %s";
LAB_0055d14b:
      Curl_failf(data,pcVar23,pcVar22);
      return CURLE_OUT_OF_MEMORY;
    }
    psVar3 = conn->ssl[lVar20].backend;
    if (((data->set).ssl.field_0xb8 & 1) != 0) {
      Curl_ossl_certchain(data,psVar3->handle);
    }
    pXVar29 = (X509 *)SSL_get1_peer_certificate(psVar3->handle);
    psVar3->server_cert = pXVar29;
    if (pXVar29 == (X509 *)0x0) {
      BIO_free(pBVar28);
      if (bVar11 != 0) {
        Curl_failf(data,"SSL: couldn\'t get peer certificate");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
      goto LAB_0055cb8c;
    }
    if ((conn->http_proxy).proxytype == '\x02') {
      pcVar22 = "Proxy";
      if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
        pcVar22 = "Server";
      }
    }
    else {
      pcVar22 = "Server";
    }
    Curl_infof(data,"%s certificate:",pcVar22);
    pXVar30 = X509_get_subject_name((X509 *)psVar3->server_cert);
    iVar14 = x509_name_oneline((X509_NAME *)pXVar30,error_buffer,size_02);
    pcVar22 = "[NONE]";
    if (iVar14 == 0) {
      pcVar22 = error_buffer;
    }
    Curl_infof(data," subject: %s",pcVar22);
    pAVar31 = (ASN1_TIME *)X509_get0_notBefore(psVar3->server_cert);
    ASN1_TIME_print(pBVar28,pAVar31);
    uVar25 = BIO_ctrl(pBVar28,3,0,&local_958);
    Curl_infof(data," start date: %.*s",uVar25 & 0xffffffff);
    BIO_ctrl(pBVar28,1,0,(void *)0x0);
    pAVar31 = (ASN1_TIME *)X509_get0_notAfter(psVar3->server_cert);
    ASN1_TIME_print(pBVar28,pAVar31);
    uVar25 = BIO_ctrl(pBVar28,3,0,&local_958);
    Curl_infof(data," expire date: %.*s",uVar25 & 0xffffffff);
    BIO_ctrl(pBVar28,1,0,(void *)0x0);
    BIO_free(pBVar28);
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar10 = (conn->proxy_ssl_config).field_0x71;
    }
    else {
      bVar10 = (conn->ssl_config).field_0x71;
    }
    if (((bVar10 & 2) != 0) &&
       (CVar17 = Curl_ossl_verifyhost(data,conn,psVar3->server_cert), CVar17 != CURLE_OK)) {
      X509_free((X509 *)psVar3->server_cert);
      psVar3->server_cert = (X509 *)0x0;
      return CVar17;
    }
    pXVar30 = X509_get_issuer_name((X509 *)psVar3->server_cert);
    iVar14 = x509_name_oneline((X509_NAME *)pXVar30,error_buffer,size_03);
    if (iVar14 == 0) {
      Curl_infof(data," issuer: %s",error_buffer);
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        pcVar34 = (conn->proxy_ssl_config).issuercert_blob;
        if ((conn->proxy_ssl_config).issuercert == (char *)0x0) goto LAB_0055dae3;
LAB_0055d476:
        if (pcVar34 != (curl_blob *)0x0) goto LAB_0055daec;
        pBVar27 = BIO_s_file();
        pBVar28 = BIO_new(pBVar27);
        if (pBVar28 == (BIO *)0x0) {
          uVar25 = ERR_get_error();
          ossl_strerror(uVar25,extramsg,size_05);
          pcVar22 = "BIO_new return NULL, OpenSSL error %s";
          goto LAB_0055e134;
        }
        if (((conn->http_proxy).proxytype != '\x02') ||
           (lVar39 = 0x318, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar39 = 0x2a0;
        }
        lVar39 = BIO_ctrl(pBVar28,0x6c,3,*(void **)((conn->chunk).hexbuffer + lVar39 + -0x3d));
        if ((int)lVar39 < 1) {
          if (bVar11 != 0) {
            if (((conn->http_proxy).proxytype != '\x02') ||
               (lVar20 = 0x318,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar20 = 0x2a0;
            }
            Curl_failf(data,"SSL: Unable to open issuer cert (%s)",
                       *(undefined8 *)((conn->chunk).hexbuffer + lVar20 + -0x3d));
          }
          BIO_free(pBVar28);
          goto LAB_0055deee;
        }
LAB_0055db06:
        pXVar35 = PEM_read_bio_X509(pBVar28,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
        if (pXVar35 == (X509 *)0x0) {
          if (bVar11 != 0) {
            if (((conn->http_proxy).proxytype != '\x02') ||
               (lVar20 = 0x318,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar20 = 0x2a0;
            }
            Curl_failf(data,"SSL: Unable to read issuer cert (%s)",
                       *(undefined8 *)((conn->chunk).hexbuffer + lVar20 + -0x3d));
          }
          BIO_free(pBVar28);
          X509_free((X509 *)0x0);
LAB_0055deee:
          X509_free((X509 *)psVar3->server_cert);
          psVar3->server_cert = (X509 *)0x0;
          return CURLE_SSL_ISSUER_ERROR;
        }
        iVar14 = X509_check_issued(pXVar35,(X509 *)psVar3->server_cert);
        if (iVar14 != 0) {
          if (bVar11 != 0) {
            if (((conn->http_proxy).proxytype != '\x02') ||
               (lVar20 = 0x318,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar20 = 0x2a0;
            }
            Curl_failf(data,"SSL: Certificate issuer check failed (%s)",
                       *(undefined8 *)((conn->chunk).hexbuffer + lVar20 + -0x3d));
          }
          BIO_free(pBVar28);
          X509_free(pXVar35);
          X509_free((X509 *)psVar3->server_cert);
          psVar3->server_cert = (X509 *)0x0;
          return CURLE_SSL_ISSUER_ERROR;
        }
        if (((conn->http_proxy).proxytype != '\x02') ||
           (lVar39 = 0x318, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar39 = 0x2a0;
        }
        Curl_infof(data," SSL certificate issuer check ok (%s)",
                   *(undefined8 *)((conn->chunk).hexbuffer + lVar39 + -0x3d));
        BIO_free(pBVar28);
        X509_free(pXVar35);
      }
      else {
        pcVar34 = (conn->ssl_config).issuercert_blob;
        if ((conn->ssl_config).issuercert != (char *)0x0) goto LAB_0055d476;
LAB_0055dae3:
        if (pcVar34 != (curl_blob *)0x0) {
LAB_0055daec:
          pBVar28 = BIO_new_mem_buf(pcVar34->data,(int)pcVar34->len);
          if (pBVar28 == (BIO *)0x0) {
            uVar25 = ERR_get_error();
            ossl_strerror(uVar25,extramsg,size_04);
            pcVar22 = "BIO_new_mem_buf NULL, OpenSSL error %s";
LAB_0055e134:
            Curl_failf(data,pcVar22,extramsg);
            X509_free((X509 *)psVar3->server_cert);
            psVar3->server_cert = (X509 *)0x0;
            return CURLE_OUT_OF_MEMORY;
          }
          goto LAB_0055db06;
        }
      }
      lVar39 = SSL_get_verify_result((SSL *)psVar3->handle);
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        (data->set).proxy_ssl.certverifyresult = lVar39;
        if (lVar39 == 0) {
LAB_0055e1aa:
          CVar17 = CURLE_OK;
          Curl_infof(data," SSL certificate verify ok.");
          goto LAB_0055d3c2;
        }
        bVar10 = (conn->proxy_ssl_config).field_0x71;
      }
      else {
        (data->set).ssl.certverifyresult = lVar39;
        if (lVar39 == 0) goto LAB_0055e1aa;
        bVar10 = (conn->ssl_config).field_0x71;
      }
      if ((bVar10 & 1) == 0) {
        pcVar22 = X509_verify_cert_error_string(lVar39);
        CVar17 = CURLE_OK;
        Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar22,
                   lVar39);
      }
      else {
        CVar17 = CURLE_PEER_FAILED_VERIFICATION;
        if (bVar11 != 0) {
          pcVar22 = X509_verify_cert_error_string(lVar39);
          Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar22,lVar39);
        }
      }
    }
    else {
      CVar17 = CURLE_PEER_FAILED_VERIFICATION;
      if (bVar11 != 0) {
        Curl_failf(data,"SSL: couldn\'t get X509-issuer name");
      }
    }
LAB_0055d3c2:
    uVar12 = (conn->http_proxy).proxytype;
    if ((uVar12 == '\x02') &&
       (iVar14 = conn->sock[1], conn->proxy_ssl[iVar14 != -1].state != ssl_connection_complete)) {
      if (((conn->proxy_ssl_config).field_0x71 & 4) == 0) {
        CVar18 = CURLE_OK;
        if (bVar11 != 0) {
          CVar18 = CVar17;
        }
        goto LAB_0055d681;
      }
LAB_0055d6ad:
      psVar4 = conn->ssl[lVar20].backend;
      lVar39 = SSL_ctrl((SSL *)psVar4->handle,0x46,0,&addr);
      if (addr.__in6_u._0_8_ == 0) {
        pcVar22 = "No OCSP response received";
LAB_0055dbdb:
        resp = (OCSP_RESPONSE *)0x0;
LAB_0055dbde:
        Curl_failf(data,pcVar22);
LAB_0055dbea:
        OCSP_RESPONSE_free(resp);
        CVar18 = CURLE_SSL_INVALIDCERTSTATUS;
      }
      else {
        ssl_sessionid = (void *)addr.__in6_u._0_8_;
        resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&ssl_sessionid,lVar39);
        if (resp == (OCSP_RESPONSE *)0x0) {
          pcVar22 = "Invalid OCSP response";
          goto LAB_0055dbdb;
        }
        uVar15 = OCSP_response_status(resp);
        if (uVar15 != 0) {
          pcVar22 = OCSP_response_status_str((long)(int)uVar15);
          Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar22,(ulong)uVar15);
          goto LAB_0055dbea;
        }
        bs = OCSP_response_get1_basic(resp);
        if (bs == (OCSP_BASICRESP *)0x0) {
          pcVar22 = "Invalid OCSP response";
          goto LAB_0055dbde;
        }
        local_9b8 = (curl_blob *)SSL_get_peer_cert_chain((SSL *)psVar4->handle);
        if (local_9b8 == (curl_blob *)0x0) {
          pcVar22 = "Could not get peer certificate chain";
LAB_0055e5e8:
          bVar45 = false;
          Curl_failf(data,pcVar22);
          CVar18 = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          pXVar37 = SSL_CTX_get_cert_store((SSL_CTX *)psVar4->ctx);
          pcVar34 = local_9b8;
          iVar14 = OCSP_basic_verify(bs,(stack_st_X509 *)local_9b8,pXVar37,0);
          if (iVar14 < 1) {
            pcVar22 = "OCSP response verification failed";
            goto LAB_0055e5e8;
          }
          local_9c0 = (X509 *)SSL_get1_peer_certificate(psVar4->handle);
          if (local_9c0 == (X509 *)0x0) {
            pcVar22 = "Error getting peer certificate";
            goto LAB_0055e5e8;
          }
          iVar14 = OPENSSL_sk_num(pcVar34);
          pXVar35 = local_9c0;
          if (0 < iVar14) {
            iVar14 = 0;
            do {
              issuer = (X509 *)OPENSSL_sk_value(pcVar34,iVar14);
              iVar19 = X509_check_issued(issuer,pXVar35);
              if (iVar19 == 0) {
                dgst = EVP_sha1();
                id = OCSP_cert_to_id(dgst,pXVar35,issuer);
                X509_free(pXVar35);
                if (id == (OCSP_CERTID *)0x0) goto LAB_0055dfe3;
                iVar14 = OCSP_resp_find_status
                                   (bs,id,&cert_status,&crl_reason,(ASN1_GENERALIZEDTIME **)&rev,
                                    (ASN1_GENERALIZEDTIME **)&thisupd,&local_950);
                OCSP_CERTID_free(id);
                if (iVar14 != 1) {
                  pcVar22 = "Could not find certificate ID in OCSP response";
                  goto LAB_0055dfea;
                }
                iVar14 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)thisupd,local_950,300,-1);
                if (iVar14 == 0) {
                  pcVar22 = "OCSP response has expired";
                  goto LAB_0055dfea;
                }
                pcVar22 = OCSP_cert_status_str((long)cert_status);
                Curl_infof(data,"SSL certificate status: %s (%d)",pcVar22,(ulong)(uint)cert_status);
                if (cert_status == 0) {
                  bVar45 = true;
                  CVar18 = CURLE_OK;
                  goto LAB_0055e5fc;
                }
                if (cert_status == 1) {
                  pcVar22 = OCSP_crl_reason_str((long)crl_reason);
                  Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar22,
                             (ulong)(uint)crl_reason);
                  goto LAB_0055dff8;
                }
                CVar18 = CURLE_SSL_INVALIDCERTSTATUS;
                bVar45 = false;
                goto LAB_0055e5fc;
              }
              iVar14 = iVar14 + 1;
              iVar19 = OPENSSL_sk_num(pcVar34);
            } while (iVar14 < iVar19);
          }
          X509_free(pXVar35);
LAB_0055dfe3:
          pcVar22 = "Error computing OCSP ID";
LAB_0055dfea:
          Curl_failf(data,pcVar22);
LAB_0055dff8:
          bVar45 = false;
          CVar18 = CURLE_SSL_INVALIDCERTSTATUS;
        }
LAB_0055e5fc:
        OCSP_BASICRESP_free(bs);
        OCSP_RESPONSE_free(resp);
        if (bVar45) {
          uVar12 = (conn->http_proxy).proxytype;
          CVar17 = CURLE_OK;
          goto LAB_0055d3fd;
        }
      }
      X509_free((X509 *)psVar3->server_cert);
      psVar3->server_cert = (X509 *)0x0;
    }
    else {
      if (((conn->ssl_config).field_0x71 & 4) != 0) goto LAB_0055d6ad;
LAB_0055d3fd:
      CVar18 = CURLE_OK;
      if (bVar11 != 0) {
        CVar18 = CVar17;
      }
      lVar39 = 0x820;
      if (uVar12 == '\x02') {
        iVar14 = conn->sock[1];
LAB_0055d681:
        lVar39 = (ulong)(conn->proxy_ssl[iVar14 != -1].state != ssl_connection_complete) * 8 + 0x820
        ;
      }
      pcVar22 = *(char **)((long)&data->magic + lVar39);
      local_958 = pcVar22;
      if ((CVar18 == CURLE_OK) && (pcVar22 != (char *)0x0)) {
        pXVar29 = psVar3->server_cert;
        if (pXVar29 == (X509 *)0x0) {
LAB_0055e1ce:
          CVar18 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar33 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar29);
          uVar15 = i2d_X509_PUBKEY(pXVar33,(uchar **)0x0);
          if ((int)uVar15 < 1) goto LAB_0055e1ce;
          uVar25 = (ulong)uVar15;
          pubkey = (uchar *)(*Curl_cmalloc)(uVar25);
          addr.__in6_u._0_8_ = pubkey;
          if (pubkey == (uchar *)0x0) goto LAB_0055e1ce;
          pXVar33 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar29);
          uVar16 = i2d_X509_PUBKEY(pXVar33,(uchar **)&addr);
          if ((addr.__in6_u._0_8_ - (long)pubkey != uVar25 || uVar15 != uVar16) ||
              addr.__in6_u._0_8_ == 0) {
            (*Curl_cfree)(pubkey);
            goto LAB_0055e1ce;
          }
          CVar18 = Curl_pin_peer_pubkey(data,pcVar22,pubkey,uVar25);
          (*Curl_cfree)(pubkey);
          if (CVar18 == CURLE_OK) {
            CVar18 = CURLE_OK;
            goto LAB_0055e1e5;
          }
        }
        Curl_failf(data,"SSL: public key does not match pinned public key");
      }
LAB_0055e1e5:
      X509_free((X509 *)psVar3->server_cert);
      psVar3->server_cert = (X509 *)0x0;
      conn->ssl[lVar20].connecting_state = ssl_connect_done;
    }
    if (CVar18 != CURLE_OK) {
      return CVar18;
    }
  }
  else if (sVar2 != ssl_connect_done) {
    _Var13 = false;
    goto LAB_0055ccd0;
  }
LAB_0055cb8c:
  conn->ssl[lVar20].state = ssl_connection_complete;
  conn->recv[local_970] = ossl_recv;
  conn->send[local_970] = ossl_send;
  _Var13 = true;
LAB_0055ccd0:
  *local_978 = _Var13;
  conn->ssl[lVar20].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(data, conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(data, conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(data, conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}